

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTopic.c
# Opt level: O1

sbfTopic sbfTopic_copy(sbfTopic topic)

{
  sbfTopic psVar1;
  char *pcVar2;
  
  psVar1 = (sbfTopic)calloc(1,0x28);
  psVar1->mType = topic->mType;
  pcVar2 = (char *)sbfMemory_strdup(topic->mTopic);
  psVar1->mTopic = pcVar2;
  pcVar2 = (char *)sbfMemory_strdup(topic->mFirst);
  psVar1->mFirst = pcVar2;
  pcVar2 = (char *)sbfMemory_strdup(topic->mSecond);
  psVar1->mSecond = pcVar2;
  pcVar2 = (char *)sbfMemory_strdup(topic->mThird);
  psVar1->mThird = pcVar2;
  return psVar1;
}

Assistant:

sbfTopic
sbfTopic_copy (sbfTopic topic)
{
    sbfTopic copy;

    copy = calloc (1, sizeof *copy);
    copy->mType = topic->mType;
    copy->mTopic = xstrdup (topic->mTopic);

    copy->mFirst = xstrdup (topic->mFirst);
    copy->mSecond = xstrdup (topic->mSecond);
    copy->mThird = xstrdup (topic->mThird);

    return copy;
}